

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void create_colorindex(j_decompress_ptr cinfo)

{
  undefined1 uVar1;
  J_DITHER_MODE JVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  undefined1 *puVar5;
  int iVar6;
  JSAMPARRAY ppJVar7;
  long lVar8;
  JDIMENSION JVar9;
  _func_void_j_decompress_ptr *p_Var10;
  undefined1 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  
  pjVar4 = cinfo->cquantize;
  JVar2 = cinfo->dither_mode;
  JVar9 = 0x100;
  if (JVar2 == JDITHER_ORDERED) {
    JVar9 = 0x2fe;
  }
  *(uint *)&pjVar4[1].new_color_map = (uint)(JVar2 == JDITHER_ORDERED);
  ppJVar7 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar9,cinfo->out_color_components);
  pjVar4[1].finish_pass = (_func_void_j_decompress_ptr *)ppJVar7;
  if (0 < cinfo->out_color_components) {
    iVar6 = *(int *)&pjVar4[1].color_quantize;
    lVar13 = 0;
    do {
      iVar3 = *(int *)((long)&pjVar4[1].new_color_map + lVar13 * 4 + 4);
      iVar6 = iVar6 / iVar3;
      p_Var10 = pjVar4[1].finish_pass;
      if (JVar2 == JDITHER_ORDERED) {
        *(long *)(p_Var10 + lVar13 * 8) = *(long *)(p_Var10 + lVar13 * 8) + 0xff;
        p_Var10 = pjVar4[1].finish_pass;
      }
      puVar5 = *(undefined1 **)(p_Var10 + lVar13 * 8);
      lVar14 = (long)(iVar3 * 2 + -2);
      lVar8 = ((long)iVar3 + 0xfe) / lVar14;
      lVar16 = 0;
      iVar15 = 0;
      do {
        if ((int)lVar8 < lVar16) {
          lVar12 = (long)iVar15 * 0x1fe + (long)iVar3 + 0x2fc;
          do {
            lVar8 = lVar12 / lVar14;
            iVar15 = iVar15 + 1;
            lVar12 = lVar12 + 0x1fe;
          } while ((int)lVar8 < lVar16);
        }
        puVar5[lVar16] = (char)iVar15 * (char)iVar6;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x100);
      if (JVar2 == JDITHER_ORDERED) {
        uVar1 = *puVar5;
        lVar8 = 0;
        puVar11 = puVar5;
        do {
          puVar11 = puVar11 + -1;
          *puVar11 = uVar1;
          puVar5[lVar8 + 0x100] = puVar5[0xff];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xff);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < cinfo->out_color_components);
  }
  return;
}

Assistant:

LOCAL(void)
create_colorindex(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPROW indexptr;
  int i, j, k, nci, blksize, val, pad;

  /* For ordered dither, we pad the color index tables by MAXJSAMPLE in
   * each direction (input index values can be -MAXJSAMPLE .. 2*MAXJSAMPLE).
   * This is not necessary in the other dithering modes.  However, we
   * flag whether it was done in case user changes dithering mode.
   */
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    pad = MAXJSAMPLE * 2;
    cquantize->is_padded = TRUE;
  } else {
    pad = 0;
    cquantize->is_padded = FALSE;
  }

  cquantize->colorindex = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1 + pad),
     (JDIMENSION)cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  blksize = cquantize->sv_actual;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colorindex entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blksize / nci;

    /* adjust colorindex pointers to provide padding at negative indexes. */
    if (pad)
      cquantize->colorindex[i] += MAXJSAMPLE;

    /* in loop, val = index of current output value, */
    /* and k = largest j that maps to current val */
    indexptr = cquantize->colorindex[i];
    val = 0;
    k = largest_input_value(cinfo, i, 0, nci - 1);
    for (j = 0; j <= MAXJSAMPLE; j++) {
      while (j > k)             /* advance val if past boundary */
        k = largest_input_value(cinfo, i, ++val, nci - 1);
      /* premultiply so that no multiplication needed in main processing */
      indexptr[j] = (JSAMPLE)(val * blksize);
    }
    /* Pad at both ends if necessary */
    if (pad)
      for (j = 1; j <= MAXJSAMPLE; j++) {
        indexptr[-j] = indexptr[0];
        indexptr[MAXJSAMPLE + j] = indexptr[MAXJSAMPLE];
      }
  }
}